

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int erkStep_SetDefaults(ARKodeMem ark_mem)

{
  long in_RDI;
  int retval;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeERKStepMem step_mem;
  ARKodeERKStepMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  SUNAdaptController in_stack_ffffffffffffffe0;
  ARKodeMem in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    in_stack_ffffffffffffffe8->itol = 4;
    in_stack_ffffffffffffffe8->ritol = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->reltol = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x308) + 0x10) = 0x3fd3333333333333;
    *(undefined8 *)(*(long *)(in_RDI + 0x308) + 0x38) = 0x3fefae147ae147ae;
    *(undefined8 *)(*(long *)(in_RDI + 0x308) + 0x40) = 0x4039000000000000;
    if (in_stack_ffffffffffffffe8->Sabstol != 0.0) {
      ARKodeButcherTable_Space
                ((ARKodeButcherTable)in_stack_ffffffffffffffe8->Sabstol,
                 (sunindextype *)&stack0xffffffffffffffd8,(sunindextype *)&stack0xffffffffffffffe0);
      *(long *)(in_RDI + 0x370) =
           *(long *)(in_RDI + 0x370) - CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
      ;
      *(long *)(in_RDI + 0x368) = *(long *)(in_RDI + 0x368) - (long)in_stack_ffffffffffffffe0;
      ARKodeButcherTable_Free((ARKodeButcherTable)CONCAT44(local_4,in_stack_ffffffffffffffd0));
    }
    in_stack_ffffffffffffffe8->Sabstol = 0.0;
    local_4 = arkReplaceAdaptController
                        (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                         in_stack_ffffffffffffffdc);
    if (local_4 == 0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int erkStep_SetDefaults(ARKodeMem ark_mem)
{
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Set default values for integrator optional inputs */
  step_mem->q      = Q_DEFAULT;                  /* method order */
  step_mem->p      = 0;                          /* embedding order */
  step_mem->stages = 0;                          /* no stages */
  ark_mem->hadapt_mem->etamxf = SUN_RCONST(0.3); /* max change on error-failed step */
  ark_mem->hadapt_mem->safety = SUN_RCONST(0.99); /* step adaptivity safety factor  */
  ark_mem->hadapt_mem->growth = SUN_RCONST(25.0); /* step adaptivity growth factor */

  /* Remove pre-existing Butcher table */
  if (step_mem->B)
  {
    ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
    ark_mem->liw -= Bliw;
    ark_mem->lrw -= Blrw;
    ARKodeButcherTable_Free(step_mem->B);
  }
  step_mem->B = NULL;

  /* Load the default SUNAdaptController */
  retval = arkReplaceAdaptController(ark_mem, NULL, SUNTRUE);
  if (retval) { return retval; }

  return (ARK_SUCCESS);
}